

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  pointer this_00;
  type pcVar3;
  ostream *poVar4;
  pointer *this_01;
  reference pbVar5;
  string *psVar6;
  undefined8 in_R8;
  undefined1 auVar7 [16];
  string_view str;
  string_view str_00;
  value_type local_558;
  string local_538;
  string_view local_518;
  string local_508;
  string_view local_4e8;
  string local_4d8;
  string_view local_4b8;
  string local_4a8;
  string_view local_488;
  string local_478;
  string_view local_458;
  string local_448;
  string local_428 [32];
  string_view local_408;
  string local_3f8;
  undefined1 local_3d8 [8];
  ostringstream depCmd;
  string local_260;
  undefined1 local_240 [8];
  string depTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string *working_dir;
  string *d_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string *d;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  LinkedTargetDirs dirs;
  string local_100;
  undefined1 local_e0 [16];
  string local_d0;
  reference local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pi;
  iterator __end2;
  iterator __begin2;
  MultipleOutputPairsType *__range2;
  undefined1 local_88 [8];
  string local_80;
  string local_50;
  undefined1 local_30 [8];
  string dir;
  cmMakefileTargetGenerator *this_local;
  
  dir.field_2._8_8_ = this;
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  cmStrCat<std::__cxx11::string&,char_const(&)[18]>
            (&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30
             ,(char (*) [18])"/DependInfo.cmake");
  std::__cxx11::string::operator=((string *)&this->InfoFileNameFull,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  cmLocalUnixMakefileGenerator3::ConvertToFullPath
            ((string *)(local_88 + 8),this->LocalGenerator,&this->InfoFileNameFull);
  std::__cxx11::string::operator=((string *)&this->InfoFileNameFull,(string *)(local_88 + 8));
  std::__cxx11::string::~string((string *)(local_88 + 8));
  std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
            (&this->InfoFileStream,
             (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
             local_88);
  std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
            ((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
             local_88);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->InfoFileStream);
  if (bVar2) {
    this_00 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
              operator->(&this->InfoFileStream);
    cmGeneratedFileStream::SetCopyIfDifferent(this_00,true);
    pcVar1 = this->LocalGenerator;
    pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->InfoFileStream);
    cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
              (pcVar1,(ostream *)pcVar3,(this->super_cmCommonTargetGenerator).GeneratorTarget);
    bVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->MultipleOutputPairs);
    if (!bVar2) {
      pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->InfoFileStream);
      poVar4 = std::operator<<((ostream *)pcVar3,"\n");
      poVar4 = std::operator<<(poVar4,"# Pairs of files generated by the same build rule.\n");
      std::operator<<(poVar4,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n");
      __end2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(&this->MultipleOutputPairs);
      pi = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->MultipleOutputPairs);
      while( true ) {
        bVar2 = std::operator!=(&__end2,(_Self *)&pi);
        if (!bVar2) break;
        local_b0 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&__end2);
        pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                 ::operator*(&this->InfoFileStream);
        poVar4 = std::operator<<((ostream *)pcVar3,"  ");
        auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_b0);
        str._M_len = auVar7._8_8_;
        str._M_str = (char *)0x0;
        local_e0 = auVar7;
        cmOutputConverter::EscapeForCMake_abi_cxx11_(&local_d0,auVar7._0_8_,str,(WrapQuotes)in_R8);
        poVar4 = std::operator<<(poVar4,(string *)&local_d0);
        poVar4 = std::operator<<(poVar4," ");
        auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)&local_b0->second);
        str_00._M_len = auVar7._8_8_;
        dirs.Forward.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar7._0_8_;
        str_00._M_str = (char *)0x0;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_100,
                   (cmOutputConverter *)
                   dirs.Forward.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,str_00,(WrapQuotes)in_R8);
        poVar4 = std::operator<<(poVar4,(string *)&local_100);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_d0);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end2);
      }
      pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->InfoFileStream);
      std::operator<<((ostream *)pcVar3,"  )\n\n");
    }
    pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->InfoFileStream);
    std::operator<<((ostream *)pcVar3,
                    "\n# Targets to which this target links which contain Fortran sources.\nset(CMAKE_Fortran_TARGET_LINKED_INFO_FILES\n"
                   );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"Fortran",&local_161);
    GetConfigName_abi_cxx11_((string *)&__range1,this);
    cmCommonTargetGenerator::GetLinkedTargetDirectories
              ((LinkedTargetDirs *)local_140,&this->super_cmCommonTargetGenerator,&local_160,
               (string *)&__range1);
    std::__cxx11::string::~string((string *)&__range1);
    std::__cxx11::string::~string((string *)&local_160);
    std::allocator<char>::~allocator(&local_161);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_140);
    d = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_140);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&d);
      if (!bVar2) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->InfoFileStream);
      poVar4 = std::operator<<((ostream *)pcVar3,"  \"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      std::operator<<(poVar4,"/DependInfo.cmake\"\n");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->InfoFileStream);
    std::operator<<((ostream *)pcVar3,"  )\n");
    pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->InfoFileStream);
    std::operator<<((ostream *)pcVar3,
                    "\n# Targets to which this target links which contain Fortran sources.\nset(CMAKE_Fortran_TARGET_FORWARD_LINKED_INFO_FILES\n"
                   );
    this_01 = &dirs.Direct.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this_01);
    d_1 = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&d_1);
      if (!bVar2) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
      pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->InfoFileStream);
      poVar4 = std::operator<<((ostream *)pcVar3,"  \"");
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      std::operator<<(poVar4,"/DependInfo.cmake\"\n");
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->InfoFileStream);
    std::operator<<((ostream *)pcVar3,"  )\n");
    cmCommonTargetGenerator::LinkedTargetDirs::~LinkedTargetDirs((LinkedTargetDirs *)local_140);
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       ((cmLocalGenerator *)this->LocalGenerator);
    pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->InfoFileStream);
    poVar4 = std::operator<<((ostream *)pcVar3,"\n");
    poVar4 = std::operator<<(poVar4,"# Fortran module output directory.\n");
    poVar4 = std::operator<<(poVar4,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"");
    cmGeneratorTarget::GetFortranModuleDirectory
              ((string *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (this->super_cmCommonTargetGenerator).GeneratorTarget,psVar6);
    poVar4 = std::operator<<(poVar4,(string *)
                                    &depends.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar4,"\")\n");
    std::__cxx11::string::~string
              ((string *)
               &depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = cmGeneratorTarget::IsFortranBuildingInstrinsicModules
                      ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if (bVar2) {
      pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
               operator*(&this->InfoFileStream);
      poVar4 = std::operator<<((ostream *)pcVar3,"\n");
      poVar4 = std::operator<<(poVar4,"# Fortran compiler is building intrinsic modules.\n");
      std::operator<<(poVar4,"set(CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES ON) \n");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&depTarget.field_2 + 8));
    cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
              (&local_260,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    cmStrCat<std::__cxx11::string,char_const(&)[8]>
              ((string *)local_240,&local_260,(char (*) [8])"/depend");
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
    poVar4 = std::operator<<((ostream *)local_3d8,"cd ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    local_408 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_3f8,(cmOutputConverter *)pcVar1,local_408,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_3f8);
    std::operator<<(poVar4," && ");
    std::__cxx11::string::~string((string *)&local_3f8);
    poVar4 = std::operator<<((ostream *)local_3d8,"$(CMAKE_COMMAND) -E cmake_depends \"");
    (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
      _vptr_cmGlobalGenerator[3])(local_428);
    poVar4 = std::operator<<(poVar4,local_428);
    poVar4 = std::operator<<(poVar4,"\" ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    local_458 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_448,(cmOutputConverter *)pcVar1,local_458,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_448);
    poVar4 = std::operator<<(poVar4," ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetCurrentSourceDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    local_488 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_478,(cmOutputConverter *)pcVar1,local_488,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_478);
    poVar4 = std::operator<<(poVar4," ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    local_4b8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_4a8,(cmOutputConverter *)pcVar1,local_4b8,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_4a8);
    poVar4 = std::operator<<(poVar4," ");
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    local_4e8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_4d8,(cmOutputConverter *)pcVar1,local_4e8,SHELL,false);
    poVar4 = std::operator<<(poVar4,(string *)&local_4d8);
    poVar4 = std::operator<<(poVar4," ");
    pcVar1 = this->LocalGenerator;
    cmsys::SystemTools::CollapseFullPath(&local_538,&this->InfoFileNameFull);
    local_518 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_538);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_508,(cmOutputConverter *)pcVar1,local_518,SHELL,false);
    std::operator<<(poVar4,(string *)&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string(local_428);
    bVar2 = cmLocalUnixMakefileGenerator3::GetColorMakefile(this->LocalGenerator);
    if (bVar2) {
      std::operator<<((ostream *)local_3d8," \"--color=$(COLOR)\"");
    }
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&depTarget.field_2 + 8),&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    if (this->CustomCommandDriver == OnDepends) {
      DriveCustomCommands(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&commands.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    pcVar1 = this->LocalGenerator;
    pcVar3 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (pcVar1,(ostream *)pcVar3,(char *)0x0,(string *)local_240,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&depTarget.field_2 + 8),true,false);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
    std::__cxx11::string::~string((string *)local_240);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&depTarget.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = cmStrCat(dir, "/DependInfo.cmake");
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream =
    cm::make_unique<cmGeneratedFileStream>(this->InfoFileNameFull);
  if (!this->InfoFileStream) {
    return;
  }
  this->InfoFileStream->SetCopyIfDifferent(true);
  this->LocalGenerator->WriteDependLanguageInfo(*this->InfoFileStream,
                                                this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if (!this->MultipleOutputPairs.empty()) {
    /* clang-format off */
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    /* clang-format on */
    for (auto const& pi : this->MultipleOutputPairs) {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi.first) << " "
        << cmOutputConverter::EscapeForCMake(pi.second) << "\n";
    }
    *this->InfoFileStream << "  )\n\n";
  }

  // Store list of targets linked directly or transitively.
  {
    /* clang-format off */
  *this->InfoFileStream
    << "\n"
       "# Targets to which this target links which contain Fortran sources.\n"
       "set(CMAKE_Fortran_TARGET_LINKED_INFO_FILES\n";
    /* clang-format on */
    auto const dirs =
      this->GetLinkedTargetDirectories("Fortran", this->GetConfigName());
    for (std::string const& d : dirs.Direct) {
      *this->InfoFileStream << "  \"" << d << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";

    /* clang-format off */
  *this->InfoFileStream
    << "\n"
       "# Targets to which this target links which contain Fortran sources.\n"
       "set(CMAKE_Fortran_TARGET_FORWARD_LINKED_INFO_FILES\n";
    /* clang-format on */
    for (std::string const& d : dirs.Forward) {
      *this->InfoFileStream << "  \"" << d << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";
  }

  std::string const& working_dir =
    this->LocalGenerator->GetCurrentBinaryDirectory();

  /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GeneratorTarget->GetFortranModuleDirectory(working_dir)
    << "\")\n";

  if (this->GeneratorTarget->IsFortranBuildingInstrinsicModules()) {
    *this->InfoFileStream
      << "\n"
      << "# Fortran compiler is building intrinsic modules.\n"
      << "set(CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES ON) \n";
  }
  /* clang-format on */

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string const depTarget = cmStrCat(
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget),
    "/depend");

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
// TODO: Account for source file properties and directory-level
// definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd "
         << (this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetBinaryDirectory(),
              cmOutputConverter::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetSourceDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetCurrentSourceDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetBinaryDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              this->LocalGenerator->GetCurrentBinaryDirectory(),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(this->InfoFileNameFull),
              cmOutputConverter::SHELL);
  if (this->LocalGenerator->GetColorMakefile()) {
    depCmd << " \"--color=$(COLOR)\"";
  }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if (this->CustomCommandDriver == OnDepends) {
    this->DriveCustomCommands(depends);
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      depTarget, depends, commands, true);
}